

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O1

uint32_t * createDFDDepthStencil(int depthBits,int stencilBits,int sizeBytes)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = (uint)(0 < stencilBits) + (uint)(0 < depthBits);
  uVar9 = iVar8 * 0x10 + 0x1c;
  puVar1 = (uint32_t *)malloc((ulong)uVar9);
  *puVar1 = uVar9;
  puVar1[1] = 0;
  puVar1[2] = iVar8 * 0x100000 + 0x180002;
  puVar1[3] = 0x10001;
  puVar1[4] = 0;
  puVar1[5] = sizeBytes;
  puVar1[6] = 0;
  if (stencilBits == 8 && depthBits == 0x18) {
    puVar1[7] = 0xd070000;
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 1;
    puVar1[0xb] = 0xe170008;
    uVar3 = 0xffffff;
  }
  else {
    if (depthBits == 0x20) {
      puVar1[7] = 0xce1f0000;
      puVar1[8] = 0;
      uVar4 = 0x3f800000;
      uVar2 = 0xbf800000;
LAB_001ce9bd:
      puVar1[9] = uVar2;
      puVar1[10] = uVar4;
    }
    else if (0 < depthBits) {
      puVar1[7] = depthBits * 0x10000 - 0x10000U | 0xe000000;
      puVar1[8] = 0;
      uVar4 = ~(-1 << ((byte)depthBits & 0x1f));
      if (0x20 < depthBits) {
        uVar4 = 0xffffffff;
      }
      uVar2 = 0;
      goto LAB_001ce9bd;
    }
    if (stencilBits < 1) {
      return puVar1;
    }
    uVar9 = stencilBits * 0x10000 - 0x10000;
    if (depthBits < 1) {
      puVar1[7] = uVar9 | 0xd000000;
      uVar3 = 1;
      lVar5 = 0x28;
      lVar6 = 0x24;
      lVar7 = 0x20;
      goto LAB_001ce9f3;
    }
    puVar1[0xb] = uVar9 | depthBits | 0xd000000;
    uVar3 = 1;
  }
  lVar5 = 0x38;
  lVar6 = 0x34;
  lVar7 = 0x30;
LAB_001ce9f3:
  *(undefined4 *)((long)puVar1 + lVar7) = 0;
  *(undefined4 *)((long)puVar1 + lVar6) = 0;
  *(undefined4 *)((long)puVar1 + lVar5) = uVar3;
  return puVar1;
}

Assistant:

uint32_t *createDFDDepthStencil(int depthBits,
                                int stencilBits,
                                int sizeBytes)
{
    /* N.B. Little-endian is assumed. */
    uint32_t *DFD = 0;
    DFD = writeHeader((depthBits > 0) + (stencilBits > 0),
                      sizeBytes, s_UNORM, i_NON_COLOR);

    /* Handle the special case of D24_UNORM_S8_UINT where the order of the
       channels is flipped by putting stencil in the LSBs. */
    if (depthBits == 24 && stencilBits == 8) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                    8, 0,
                    1, 1, s_UINT);
        writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    24, 8,
                    1, 1, s_UNORM);
        return DFD;
    }

    if (depthBits == 32) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    32, 0,
                    1, 1, s_SFLOAT);
    } else if (depthBits > 0) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    depthBits, 0,
                    1, 1, s_UNORM);
    }
    if (stencilBits > 0) {
        if (depthBits > 0) {
            writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, depthBits,
                        1, 1, s_UINT);
        } else {
            writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, 0,
                        1, 1, s_UINT);
        }
    }
    return DFD;
}